

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fkChildIsModified(Table *pTab,FKey *p,int *aChange,int bChngRowid)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = p->nCol;
  if (p->nCol < 1) {
    uVar3 = 0;
  }
  lVar4 = 0;
  do {
    lVar1 = lVar4 + 0x10;
    if ((ulong)uVar3 * 0x10 + 0x10 == lVar1) {
      return 0;
    }
    iVar2 = *(int *)((long)&p->aCol[0].iFrom + lVar4);
  } while ((aChange[iVar2] < 0) && ((lVar4 = lVar1, bChngRowid == 0 || (iVar2 != pTab->iPKey))));
  return 1;
}

Assistant:

static int fkChildIsModified(
  Table *pTab,                    /* Table being updated */
  FKey *p,                        /* Foreign key for which pTab is the child */
  int *aChange,                   /* Array indicating modified columns */
  int bChngRowid                  /* True if rowid is modified by this update */
){
  int i;
  for(i=0; i<p->nCol; i++){
    int iChildKey = p->aCol[i].iFrom;
    if( aChange[iChildKey]>=0 ) return 1;
    if( iChildKey==pTab->iPKey && bChngRowid ) return 1;
  }
  return 0;
}